

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

Var Js::ProfilingHelpers::ProfiledNewScObjArraySpread_Jit
              (AuxArray<unsigned_int> *spreadIndices,Var callee,void *framePointer,
              ProfileId profileId,ProfileId arrayProfileId,CallInfo callInfo,...)

{
  code *pcVar1;
  long lVar2;
  Var pvVar3;
  ProfileId arrayProfileId_00;
  ProfileId profileId_00;
  bool bVar4;
  int n;
  Var *values;
  undefined4 *puVar5;
  JavascriptCallStackLayout *pJVar6;
  ScriptFunction *caller;
  ScriptContext *scriptContext_00;
  ThreadContext *this;
  ulong __n;
  Type __s;
  undefined8 uStack_140;
  Var local_138;
  Var local_130;
  Arguments local_120;
  Arguments local_110;
  Arguments local_100;
  ulong local_f0;
  size_t outArgsSize;
  Var stackArgs [8];
  undefined1 local_a0 [4];
  uint STACK_ARGS_ALLOCA_THRESHOLD;
  CallInfo local_90;
  undefined1 local_88 [8];
  Arguments outArgs;
  uint32 spreadSize;
  ScriptContext *scriptContext;
  ScriptFunction *function;
  ArgumentReader args;
  Var *_argsVarArray;
  ProfileId arrayProfileId_local;
  void *pvStack_30;
  ProfileId profileId_local;
  void *framePointer_local;
  Var callee_local;
  AuxArray<unsigned_int> *spreadIndices_local;
  CallInfo callInfo_local;
  
  __s = (Type)&local_138;
  uStack_140 = 0xffb867;
  _argsVarArray._4_2_ = arrayProfileId;
  _argsVarArray._6_2_ = profileId;
  pvStack_30 = framePointer;
  framePointer_local = callee;
  callee_local = spreadIndices;
  spreadIndices_local = (AuxArray<unsigned_int> *)callInfo;
  n = _count_args<Js::AuxArray<unsigned_int>const*,void*,void*,unsigned_short,unsigned_short>
                ((AuxArray<unsigned_int> **)&callee_local,&framePointer_local,
                 &stack0xffffffffffffffd0,(unsigned_short *)((long)&_argsVarArray + 6),
                 (unsigned_short *)((long)&_argsVarArray + 4),callInfo);
  uStack_140 = 0xffb875;
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)spreadIndices_local;
  uStack_140 = 0xffb892;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)spreadIndices_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    uStack_140 = 0xffb8b0;
    Throw::LogAssert();
    uStack_140 = 0xffb8c0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    uStack_140 = 0xffb8e5;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x226,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    uStack_140 = 0xffb8fb;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uStack_140 = 0xffb914;
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&function,(CallInfo *)&spreadIndices_local,values);
  uStack_140 = 0xffb91d;
  pJVar6 = JavascriptCallStackLayout::FromFramePointer(pvStack_30);
  uStack_140 = 0xffb925;
  caller = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar6);
  uStack_140 = 0xffb932;
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)caller);
  outArgs.Values._4_4_ = 0;
  if (callee_local == (Var)0x0) {
    local_138 = framePointer_local;
    uStack_140 = 0xffbb79;
    Arguments::Arguments(&local_120,(Arguments *)&function);
    uStack_140 = 0xffbb9c;
    callInfo_local =
         (CallInfo)
         ProfiledNewScObjArray(local_138,&local_120,caller,_argsVarArray._6_2_,_argsVarArray._4_2_);
  }
  else {
    uStack_140 = 0xffb966;
    CallInfo::CallInfo(&local_90,
                       function._3_4_ &
                       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                        CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                       CallFlags_New),0);
    uStack_140 = 0xffb97a;
    Arguments::Arguments((Arguments *)local_88,local_90,(Var *)0x0);
    uStack_140 = 0xffb98a;
    Arguments::Arguments((Arguments *)local_a0,(Arguments *)&function);
    uStack_140 = 0xffb99e;
    outArgs.Values._4_4_ =
         JavascriptFunction::GetSpreadSize
                   ((Arguments *)local_a0,(AuxArray<unsigned_int> *)callee_local,scriptContext_00);
    if (outArgs.Values._4_4_ != (outArgs.Values._4_4_ & 0xffffff)) {
      AssertCount = AssertCount + 1;
      uStack_140 = 0xffb9cb;
      Throw::LogAssert();
      uStack_140 = 0xffb9db;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      uStack_140 = 0xffba00;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x232,"(spreadSize == (((1 << 24) - 1) & spreadSize))",
                                  "spreadSize == (((1 << 24) - 1) & spreadSize)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      uStack_140 = 0xffba16;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    local_88 = (undefined1  [8])
               ((ulong)local_88 & 0xffffffffff000000 | (ulong)outArgs.Values._4_4_ & 0xffffff);
    stackArgs[7]._4_4_ = 8;
    local_f0 = 0;
    if ((local_88._0_4_ & 0xffffff) < 9) {
      outArgs.Info = (Type)&outArgsSize;
      local_f0 = 0x40;
      uStack_140 = 0xffbaf2;
      memset((void *)outArgs.Info,0,0x40);
    }
    else {
      uStack_140 = 0xffba68;
      this = ScriptContext::GetThreadContext(scriptContext_00);
      uStack_140 = 0xffba88;
      ThreadContext::ProbeStack
                (this,(ulong)(local_88._0_4_ & 0xffffff) * 8 + 0xc00,scriptContext_00,(PVOID)0x0);
      __n = (ulong)((local_88._0_4_ & 0xffffff) << 3);
      lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
      __s = (Type)((long)&local_138 + lVar2);
      local_f0 = __n;
      outArgs.Info = __s;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0xffbac8;
      memset((void *)__s,0,__n);
    }
    *(undefined8 *)((long)__s + -8) = 0xffbb02;
    Arguments::Arguments(&local_100,(Arguments *)&function);
    pvVar3 = callee_local;
    *(undefined8 *)((long)__s + -8) = 0xffbb1a;
    JavascriptFunction::SpreadArgs
              (&local_100,(Arguments *)local_88,(AuxArray<unsigned_int> *)pvVar3,scriptContext_00);
    local_130 = framePointer_local;
    *(undefined8 *)((long)__s + -8) = 0xffbb35;
    Arguments::Arguments(&local_110,(Arguments *)local_88);
    profileId_00 = _argsVarArray._6_2_;
    arrayProfileId_00 = _argsVarArray._4_2_;
    pvVar3 = local_130;
    *(undefined8 *)((long)__s + -8) = 0xffbb58;
    callInfo_local =
         (CallInfo)ProfiledNewScObjArray(pvVar3,&local_110,caller,profileId_00,arrayProfileId_00);
  }
  return (Var)callInfo_local;
}

Assistant:

Var ProfilingHelpers::ProfiledNewScObjArraySpread_Jit(
        const Js::AuxArray<uint32> *spreadIndices,
        const Var callee,
        void *const framePointer,
        const ProfileId profileId,
        const ProfileId arrayProfileId,
        CallInfo callInfo,
        ...)
    {
        ARGUMENTS(args, spreadIndices, callee, framePointer, profileId, arrayProfileId, callInfo);

        Js::ScriptFunction *function = UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        ScriptContext* scriptContext = function->GetScriptContext();

        JIT_HELPER_REENTRANT_HEADER(ProfiledNewScObjArraySpread);
        // GetSpreadSize ensures that spreadSize < 2^24
        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            Arguments outArgs(CallInfo(args.Info.Flags, 0), nullptr);
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);
            Assert(spreadSize == (((1 << 24) - 1) & spreadSize));
            // Allocate room on the stack for the spread args.
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);
            return
                ProfiledNewScObjArray(
                    callee,
                    outArgs,
                    function,
                    profileId,
                    arrayProfileId);
        }
        else
        {
            return
                ProfiledNewScObjArray(
                    callee,
                    args,
                    function,
                    profileId,
                    arrayProfileId);
        }
        JIT_HELPER_END(ProfiledNewScObjArraySpread);
    }